

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptArray::SetProperty
          (JavascriptArray *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  BOOL BVar1;
  ScriptContext *this_00;
  uint local_3c;
  PropertyValueInfo *pPStack_38;
  uint32 indexValue;
  PropertyValueInfo *info_local;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var value_local;
  JavascriptArray *pJStack_18;
  PropertyId propertyId_local;
  JavascriptArray *this_local;
  
  pPStack_38 = info;
  info_local._4_4_ = flags;
  pvStack_28 = value;
  value_local._4_4_ = propertyId;
  pJStack_18 = this;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
  if (value_local._4_4_ == 0xd1) {
    this_local._4_4_ = SetLength(this,pvStack_28);
  }
  else {
    this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    BVar1 = ScriptContext::IsNumericPropertyId(this_00,value_local._4_4_,&local_3c);
    if (BVar1 == 0) {
      this_local._4_4_ =
           DynamicObject::SetProperty
                     ((DynamicObject *)this,value_local._4_4_,pvStack_28,info_local._4_4_,pPStack_38
                     );
    }
    else {
      this_local._4_4_ =
           (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
             super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29]
           )(this,(ulong)local_3c,pvStack_28,(ulong)info_local._4_4_);
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptArray::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        uint32 indexValue;
        if (propertyId == PropertyIds::length)
        {
            return this->SetLength(value);
        }
        else if (GetScriptContext()->IsNumericPropertyId(propertyId, &indexValue))
        {
            // Call this or subclass method
            return SetItem(indexValue, value, flags);
        }
        else
        {
            return DynamicObject::SetProperty(propertyId, value, flags, info);
        }
    }